

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

size_t quicly_decode_packet
                 (quicly_context_t *ctx,quicly_decoded_packet_t *packet,uint8_t *datagram,
                 size_t datagram_size,size_t *off)

{
  long *plVar1;
  long *plVar2;
  uint32_t uVar3;
  byte *end;
  long lVar4;
  uint64_t uVar5;
  size_t len;
  ulong in_RCX;
  byte *pbVar6;
  byte *in_RDX;
  long *in_RSI;
  long in_RDI;
  ulong *in_R8;
  ptls_iovec_t pVar7;
  size_t local_cidl;
  uint64_t token_len;
  uint64_t rest_length;
  uint8_t *src_end;
  uint8_t *src;
  ulong local_d8;
  uint8_t *local_c8;
  size_t local_c0;
  uint8_t *local_b8;
  size_t local_b0;
  uint8_t *local_a8;
  size_t local_a0;
  uint8_t *local_90;
  size_t local_88;
  uint8_t *local_78;
  size_t local_70;
  uint8_t *local_60;
  size_t local_58;
  uint8_t *local_50;
  size_t local_48;
  byte *local_38;
  ulong *local_30;
  ulong local_28;
  long *local_18;
  long local_10;
  
  end = in_RDX + in_RCX;
  if (in_RCX < *in_R8) {
    __assert_fail("*off <= datagram_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x261,
                  "size_t quicly_decode_packet(quicly_context_t *, quicly_decoded_packet_t *, const uint8_t *, size_t, size_t *)"
                 );
  }
  local_38 = in_RDX;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  pVar7 = ptls_iovec_init(in_RDX + *in_R8,in_RCX - *in_R8);
  plVar1 = local_18;
  local_50 = pVar7.base;
  *in_RSI = (long)local_50;
  local_48 = pVar7.len;
  in_RSI[1] = local_48;
  if (1 < (ulong)local_18[1]) {
    if (*local_30 == 0) {
      local_d8 = local_28;
    }
    else {
      local_d8 = 0;
    }
    local_18[0xd] = local_d8;
    pVar7 = ptls_iovec_init((void *)0x0,0);
    plVar2 = local_18;
    local_60 = pVar7.base;
    plVar1[10] = (long)local_60;
    local_58 = pVar7.len;
    plVar1[0xb] = local_58;
    local_18[0xe] = -1;
    local_38 = local_38 + *local_30 + 1;
    if ((*(byte *)*local_18 & 0x80) == 0) {
      if (*(long *)(local_10 + 0xa8) == 0) {
        pVar7 = ptls_iovec_init((void *)0x0,0);
        local_b8 = pVar7.base;
        plVar2[2] = (long)local_b8;
        local_b0 = pVar7.len;
        plVar2[3] = local_b0;
        local_18[4] = quicly_cid_plaintext_invalid._0_8_;
        local_18[5] = quicly_cid_plaintext_invalid.node_id;
      }
      else {
        if ((long)end - (long)local_38 < 0x14) {
          return 0xffffffffffffffff;
        }
        len = (**(code **)(*(long *)(local_10 + 0xa8) + 8))
                        (*(undefined8 *)(local_10 + 0xa8),local_18 + 4,local_38,0);
        plVar1 = local_18;
        if (len == 0xffffffffffffffff) {
          return 0xffffffffffffffff;
        }
        pVar7 = ptls_iovec_init(local_38,len);
        local_a8 = pVar7.base;
        plVar1[2] = (long)local_a8;
        local_a0 = pVar7.len;
        plVar1[3] = local_a0;
        local_38 = local_38 + len;
      }
      plVar1 = local_18;
      *(byte *)(local_18 + 6) = *(byte *)(local_18 + 6) & 0xfe;
      pVar7 = ptls_iovec_init((void *)0x0,0);
      local_c8 = pVar7.base;
      plVar1[7] = (long)local_c8;
      local_c0 = pVar7.len;
      plVar1[8] = local_c0;
      *(undefined4 *)(local_18 + 9) = 0;
      local_18[0xc] = (long)local_38 - *local_18;
      *(undefined4 *)(local_18 + 0x10) = 0;
LAB_0012e7b9:
      *local_30 = local_18[1] + *local_30;
      return local_18[1];
    }
    if (4 < (long)end - (long)local_38) {
      uVar3 = quicly_decode32(&local_38);
      *(uint32_t *)(local_18 + 9) = uVar3;
      pbVar6 = local_38 + 1;
      local_18[3] = (ulong)*local_38;
      if (local_18[3] + 1U <= (ulong)((long)end - (long)pbVar6)) {
        local_18[2] = (long)pbVar6;
        local_38 = pbVar6 + local_18[3] + 1;
        local_18[8] = (ulong)pbVar6[local_18[3]];
        if ((ulong)local_18[8] <= (ulong)((long)end - (long)local_38)) {
          local_18[7] = (long)local_38;
          local_38 = local_38 + local_18[8];
          if ((*(byte *)*local_18 & 0xf0 | 0x10) == 0xd0) {
            if (((*(long *)(local_10 + 0xa8) == 0) || (local_18[3] == 0)) ||
               (lVar4 = (**(code **)(*(long *)(local_10 + 0xa8) + 8))
                                  (*(undefined8 *)(local_10 + 0xa8),local_18 + 4,local_18[2],
                                   local_18[3]), lVar4 == -1)) {
              local_18[4] = quicly_cid_plaintext_invalid._0_8_;
              local_18[5] = quicly_cid_plaintext_invalid.node_id;
            }
            *(byte *)(local_18 + 6) = *(byte *)(local_18 + 6) & 0xfe | 1;
          }
          else {
            if (*(long *)(local_10 + 0xa8) == 0) {
              local_18[4] = quicly_cid_plaintext_invalid._0_8_;
              local_18[5] = quicly_cid_plaintext_invalid.node_id;
            }
            else {
              if (local_18[3] == 0) {
                return 0xffffffffffffffff;
              }
              lVar4 = (**(code **)(*(long *)(local_10 + 0xa8) + 8))
                                (*(undefined8 *)(local_10 + 0xa8),local_18 + 4,local_18[2],
                                 local_18[3]);
              if (lVar4 == -1) {
                return 0xffffffffffffffff;
              }
            }
            *(byte *)(local_18 + 6) = *(byte *)(local_18 + 6) & 0xfe;
          }
          plVar1 = local_18;
          if (((int)local_18[9] == -0xffffe5) || ((int)local_18[9] == -0xffffe3)) {
            if ((*(byte *)*local_18 & 0xf0) == 0xf0) {
              if ((long)end - (long)local_38 < 0x11) {
                return 0xffffffffffffffff;
              }
              pVar7 = ptls_iovec_init(local_38,(size_t)(end + (-0x10 - (long)local_38)));
              local_78 = pVar7.base;
              plVar1[10] = (long)local_78;
              local_70 = pVar7.len;
              plVar1[0xb] = local_70;
              local_18[0xc] = (long)(local_38 + (local_18[0xb] - *local_18));
            }
            else {
              if ((*(byte *)*local_18 & 0xf0) == 0xc0) {
                uVar5 = ptls_decode_quicint(&local_38,end);
                plVar1 = local_18;
                if (uVar5 == 0xffffffffffffffff) {
                  return 0xffffffffffffffff;
                }
                if ((ulong)((long)end - (long)local_38) < uVar5) {
                  return 0xffffffffffffffff;
                }
                pVar7 = ptls_iovec_init(local_38,uVar5);
                local_90 = pVar7.base;
                plVar1[10] = (long)local_90;
                local_88 = pVar7.len;
                plVar1[0xb] = local_88;
                local_38 = local_38 + uVar5;
              }
              uVar5 = ptls_decode_quicint(&local_38,end);
              if (uVar5 == 0xffffffffffffffff) {
                return 0xffffffffffffffff;
              }
              if (uVar5 == 0) {
                return 0xffffffffffffffff;
              }
              if ((ulong)((long)end - (long)local_38) < uVar5) {
                return 0xffffffffffffffff;
              }
              local_18[0xc] = (long)local_38 - *local_18;
              local_18[1] = local_18[0xc] + uVar5;
            }
          }
          else {
            local_18[0xc] = (long)local_38 - *local_18;
          }
          *(undefined4 *)(local_18 + 0x10) = 2;
          goto LAB_0012e7b9;
        }
      }
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t quicly_decode_packet(quicly_context_t *ctx, quicly_decoded_packet_t *packet, const uint8_t *datagram, size_t datagram_size,
                            size_t *off)
{
    const uint8_t *src = datagram, *src_end = datagram + datagram_size;

    assert(*off <= datagram_size);

    packet->octets = ptls_iovec_init(src + *off, datagram_size - *off);
    if (packet->octets.len < 2)
        goto Error;
    packet->datagram_size = *off == 0 ? datagram_size : 0;
    packet->token = ptls_iovec_init(NULL, 0);
    packet->decrypted.pn = UINT64_MAX;

    /* move the cursor to the second byte */
    src += *off + 1;

    if (QUICLY_PACKET_IS_LONG_HEADER(packet->octets.base[0])) {
        /* long header */
        uint64_t rest_length;
        if (src_end - src < 5)
            goto Error;
        packet->version = quicly_decode32(&src);
        packet->cid.dest.encrypted.len = *src++;
        if (src_end - src < packet->cid.dest.encrypted.len + 1)
            goto Error;
        packet->cid.dest.encrypted.base = (uint8_t *)src;
        src += packet->cid.dest.encrypted.len;
        packet->cid.src.len = *src++;
        if (src_end - src < packet->cid.src.len)
            goto Error;
        packet->cid.src.base = (uint8_t *)src;
        src += packet->cid.src.len;
        switch (packet->octets.base[0] & QUICLY_PACKET_TYPE_BITMASK) {
        case QUICLY_PACKET_TYPE_INITIAL:
        case QUICLY_PACKET_TYPE_0RTT:
            if (ctx->cid_encryptor == NULL || packet->cid.dest.encrypted.len == 0 ||
                ctx->cid_encryptor->decrypt_cid(ctx->cid_encryptor, &packet->cid.dest.plaintext, packet->cid.dest.encrypted.base,
                                                packet->cid.dest.encrypted.len) == SIZE_MAX)
                packet->cid.dest.plaintext = quicly_cid_plaintext_invalid;
            packet->cid.dest.might_be_client_generated = 1;
            break;
        default:
            if (ctx->cid_encryptor != NULL) {
                if (packet->cid.dest.encrypted.len == 0)
                    goto Error;
                if (ctx->cid_encryptor->decrypt_cid(ctx->cid_encryptor, &packet->cid.dest.plaintext,
                                                    packet->cid.dest.encrypted.base, packet->cid.dest.encrypted.len) == SIZE_MAX)
                    goto Error;
            } else {
                packet->cid.dest.plaintext = quicly_cid_plaintext_invalid;
            }
            packet->cid.dest.might_be_client_generated = 0;
            break;
        }
        switch (packet->version) {
        case QUICLY_PROTOCOL_VERSION_CURRENT:
        case QUICLY_PROTOCOL_VERSION_DRAFT27:
            /* these are the recognized versions, and they share the same packet header format */
            if ((packet->octets.base[0] & QUICLY_PACKET_TYPE_BITMASK) == QUICLY_PACKET_TYPE_RETRY) {
                /* retry */
                if (src_end - src <= PTLS_AESGCM_TAG_SIZE)
                    goto Error;
                packet->token = ptls_iovec_init(src, src_end - src - PTLS_AESGCM_TAG_SIZE);
                src += packet->token.len;
                packet->encrypted_off = src - packet->octets.base;
            } else {
                /* coalescible long header packet */
                if ((packet->octets.base[0] & QUICLY_PACKET_TYPE_BITMASK) == QUICLY_PACKET_TYPE_INITIAL) {
                    /* initial has a token */
                    uint64_t token_len;
                    if ((token_len = quicly_decodev(&src, src_end)) == UINT64_MAX)
                        goto Error;
                    if (src_end - src < token_len)
                        goto Error;
                    packet->token = ptls_iovec_init(src, token_len);
                    src += token_len;
                }
                if ((rest_length = quicly_decodev(&src, src_end)) == UINT64_MAX)
                    goto Error;
                if (rest_length < 1)
                    goto Error;
                if (src_end - src < rest_length)
                    goto Error;
                packet->encrypted_off = src - packet->octets.base;
                packet->octets.len = packet->encrypted_off + rest_length;
            }
            break;
        default:
            /* VN packet or packets of unknown version cannot be parsed. `encrypted_off` is set to the first byte after SCID. */
            packet->encrypted_off = src - packet->octets.base;
        }
        packet->_is_stateless_reset_cached = QUICLY__DECODED_PACKET_CACHED_NOT_STATELESS_RESET;
    } else {
        /* short header */
        if (ctx->cid_encryptor != NULL) {
            if (src_end - src < QUICLY_MAX_CID_LEN_V1)
                goto Error;
            size_t local_cidl = ctx->cid_encryptor->decrypt_cid(ctx->cid_encryptor, &packet->cid.dest.plaintext, src, 0);
            if (local_cidl == SIZE_MAX)
                goto Error;
            packet->cid.dest.encrypted = ptls_iovec_init(src, local_cidl);
            src += local_cidl;
        } else {
            packet->cid.dest.encrypted = ptls_iovec_init(NULL, 0);
            packet->cid.dest.plaintext = quicly_cid_plaintext_invalid;
        }
        packet->cid.dest.might_be_client_generated = 0;
        packet->cid.src = ptls_iovec_init(NULL, 0);
        packet->version = 0;
        packet->encrypted_off = src - packet->octets.base;
        packet->_is_stateless_reset_cached = QUICLY__DECODED_PACKET_CACHED_MAYBE_STATELESS_RESET;
    }

    *off += packet->octets.len;
    return packet->octets.len;

Error:
    return SIZE_MAX;
}